

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

TidyOption tidyGetNextOption(TidyDoc tdoc,TidyIterator *pos)

{
  undefined8 local_28;
  TidyOptionImpl *option;
  TidyDocImpl *impl;
  TidyIterator *pos_local;
  TidyDoc tdoc_local;
  
  local_28 = (TidyOptionImpl *)0x0;
  if (tdoc == (TidyDoc)0x0) {
    if (pos != (TidyIterator *)0x0) {
      *pos = (TidyIterator)0x0;
    }
  }
  else {
    local_28 = prvTidygetNextOption((TidyDocImpl *)tdoc,pos);
  }
  return (TidyOption)local_28;
}

Assistant:

TidyOption TIDY_CALL    tidyGetNextOption( TidyDoc tdoc, TidyIterator* pos )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    const TidyOptionImpl* option = NULL;
    if ( impl )
        option = TY_(getNextOption)( impl, pos );
    else if ( pos )
        *pos = 0;
    return tidyImplToOption( option );
}